

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void __thiscall HTTPWorkItem::operator()(HTTPWorkItem *this)

{
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  HTTPRequest *__args;
  
  __args = *(HTTPRequest **)(in_FS_OFFSET + 0x28);
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RDI[1].super__Function_base._M_manager;
  std::unique_ptr<HTTPRequest,_std::default_delete<HTTPRequest>_>::get(in_stack_ffffffffffffffd8);
  std::
  function<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(in_RDI,__args,__args_1);
  if (*(HTTPRequest **)(in_FS_OFFSET + 0x28) == __args) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void operator()() override
    {
        func(req.get(), path);
    }